

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

Argument * __thiscall
argparse::ArgumentParser::operator[](ArgumentParser *this,string_view aArgumentName)

{
  bool bVar1;
  reference pAVar2;
  logic_error *this_00;
  const_iterator tIterator;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_28;
  _Self local_20 [4];
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x1c78de);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::operator!=(local_20,&local_28);
  if (!bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"No such argument");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::
  _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
  ::operator->((_Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>
                *)0x1c7918);
  pAVar2 = std::_List_iterator<argparse::Argument>::operator*
                     ((_List_iterator<argparse::Argument> *)0x1c7924);
  return pAVar2;
}

Assistant:

Argument &operator[](std::string_view aArgumentName) const {
    auto tIterator = mArgumentMap.find(aArgumentName);
    if (tIterator != mArgumentMap.end()) {
      return *(tIterator->second);
    }
    throw std::logic_error("No such argument");
  }